

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O1

StringPtr capnp::operator*(uint param_1)

{
  StringPtr SVar1;
  
  if (param_1 < 3) {
    SVar1.content.ptr = &DAT_00235428 + *(int *)(&DAT_00235428 + (ulong)param_1 * 4);
    SVar1.content.size_ = *(size_t *)(&DAT_00235410 + (ulong)param_1 * 8);
    return (StringPtr)SVar1.content;
  }
  kj::_::unreachable();
}

Assistant:

kj::StringPtr KJ_STRINGIFY(Equality res) {
  switch(res) {
    case Equality::NOT_EQUAL:
      return "NOT_EQUAL";
    case Equality::EQUAL:
      return "EQUAL";
    case Equality::UNKNOWN_CONTAINS_CAPS:
      return "UNKNOWN_CONTAINS_CAPS";
  }
  KJ_UNREACHABLE;
}